

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O2

bit_cost_t __thiscall
lzham::lzcompressor::state::get_len2_match_cost
          (state *this,CLZBase *lzbase,uint dict_pos,uint len2_match_dist,uint is_match_model_index)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  long lVar4;
  ulong uVar5;
  uint match_extra;
  uint match_slot;
  undefined8 local_28;
  
  uVar2 = *(uint *)((long)&g_prob_cost +
                   (ulong)(0x800 - this->m_is_match_model[is_match_model_index].m_bit_0_prob) * 4);
  uVar3 = *(uint *)((long)&g_prob_cost +
                   (ulong)this->m_is_rep_model[(this->super_state_base).m_cur_state].m_bit_0_prob *
                   4);
  local_28 = in_RAX;
  CLZBase::compute_lzx_position_slot
            (lzbase,len2_match_dist,(uint *)((long)&local_28 + 4),(uint *)&local_28);
  bVar1 = *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + (ulong)local_28._4_4_);
  if (bVar1 < 3) {
    lVar4 = (ulong)bVar1 << 0x18;
  }
  else {
    uVar5 = 0;
    if (4 < bVar1) {
      uVar5 = (ulong)((uint)bVar1 * 0x1000000 + 0xfc000000);
    }
    lVar4 = (ulong)*(byte *)(*(long *)&this->field_0x4f8 + (ulong)((uint)local_28 & 0xf)) *
            0x1000000 + uVar5;
  }
  return (ulong)*(byte *)(*(long *)&this->field_0x228 + (ulong)(local_28._4_4_ * 8 - 6)) * 0x1000000
         + (ulong)uVar2 + (ulong)uVar3 + lVar4;
}

Assistant:

bit_cost_t lzcompressor::state::get_len2_match_cost(CLZBase& lzbase, uint dict_pos, uint len2_match_dist, uint is_match_model_index)
   {
      LZHAM_NOTE_UNUSED(dict_pos);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      // full match
      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(len2_match_dist, match_slot, match_extra);

      const uint match_len = 2;
      uint match_low_sym = match_len - 2;

      uint match_high_sym = 0;

      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
      match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      uint main_sym = match_low_sym | (match_high_sym << 3);

      cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      return cost;
   }